

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O0

double __thiscall
crnlib::vec<16U,_float>::normalize(vec<16U,_float> *this,vec<16U,_float> *pDefaultVec)

{
  vec<16U,_float> *in_RSI;
  vec<16U,_float> *in_RDI;
  double dVar1;
  uint i;
  double n;
  uint local_1c;
  double local_18;
  
  local_18 = (double)(in_RDI->m_s[0] * in_RDI->m_s[0]);
  for (local_1c = 1; local_1c < 0x10; local_1c = local_1c + 1) {
    local_18 = (double)(in_RDI->m_s[local_1c] * in_RDI->m_s[local_1c]) + local_18;
  }
  if ((local_18 != 0.0) || (NAN(local_18))) {
    dVar1 = sqrt(local_18);
    operator*=(in_RDI,(float)(1.0 / dVar1));
  }
  else if (in_RSI != (vec<16U,_float> *)0x0) {
    operator=(in_RDI,in_RSI);
  }
  return local_18;
}

Assistant:

inline double normalize(const vec* pDefaultVec = NULL) {
    double n = m_s[0] * m_s[0];
    for (uint i = 1; i < N; i++)
      n += m_s[i] * m_s[i];

    if (n != 0)
      *this *= static_cast<T>((1.0f / sqrt(n)));
    else if (pDefaultVec)
      *this = *pDefaultVec;
    return n;
  }